

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O3

void __thiscall
flatbuffers::swift::SwiftGenerator::GenerateStructArgs
          (SwiftGenerator *this,StructDef *struct_def,string *code_ptr,string *nameprefix,
          string *object_name,string *obj_api_named,bool is_obj_api)

{
  FieldDef *field;
  StructDef *struct_def_00;
  pointer pcVar1;
  IdlNamer *pIVar2;
  long *plVar3;
  size_type *psVar4;
  long *plVar5;
  pointer ppFVar6;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  string field_field;
  string type;
  string field_var;
  string local_188;
  string *local_168;
  long *local_160;
  long local_158;
  long local_150;
  long lStack_148;
  string local_140;
  string local_120;
  SwiftGenerator *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  string *local_b0;
  string *local_a8;
  StructDef *local_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  IdlNamer *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppFVar6 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar6 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_58 = &this->namer_;
    local_168 = code_ptr;
    local_100 = this;
    local_b8 = nameprefix;
    local_b0 = obj_api_named;
    local_a8 = object_name;
    local_a0 = struct_def;
    do {
      pIVar2 = local_58;
      field = *ppFVar6;
      if (field->deprecated == false) {
        if (((field->value).type.base_type == BASE_TYPE_STRUCT) &&
           (struct_def_00 = (field->value).type.struct_def, struct_def_00->fixed == true)) {
          std::operator+(&local_d8,local_b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field)
          ;
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          pcVar1 = (local_a8->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_120,pcVar1,pcVar1 + local_a8->_M_string_length);
          std::__cxx11::string::append((char *)&local_120);
          plVar3 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_120,
                                      (ulong)(field->super_Definition).name._M_dataplus._M_p);
          local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
          psVar4 = (size_type *)(plVar3 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar4) {
            local_140.field_2._M_allocated_capacity = *psVar4;
            local_140.field_2._8_8_ = plVar3[3];
          }
          else {
            local_140.field_2._M_allocated_capacity = *psVar4;
            local_140._M_dataplus._M_p = (pointer)*plVar3;
          }
          local_140._M_string_length = plVar3[1];
          *plVar3 = (long)psVar4;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          GenerateStructArgs(local_100,struct_def_00,local_168,&local_d8,&local_140,local_b0,
                             is_obj_api);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
          }
          uVar7 = local_120.field_2._M_allocated_capacity;
          _Var8._M_p = local_120._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
LAB_002f1b8a:
            operator_delete(_Var8._M_p,uVar7 + 1);
          }
        }
        else {
          (*(local_58->super_Namer)._vptr_Namer[7])(&local_d8,local_58,field);
          (*(pIVar2->super_Namer)._vptr_Namer[0x12])(&local_140,pIVar2,field);
          GenType_abi_cxx11_(&local_120,local_100,&(field->value).type,false);
          if (is_obj_api) {
            std::operator+(&local_50,local_b8,&local_d8);
            plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
            local_98 = &local_88;
            plVar5 = plVar3 + 2;
            if ((long *)*plVar3 == plVar5) {
              local_88 = *plVar5;
              lStack_80 = plVar3[3];
            }
            else {
              local_88 = *plVar5;
              local_98 = (long *)*plVar3;
            }
            local_90 = plVar3[1];
            *plVar3 = (long)plVar5;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            plVar3 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_98,(ulong)(local_b0->_M_dataplus)._M_p);
            local_78 = &local_68;
            plVar5 = plVar3 + 2;
            if ((long *)*plVar3 == plVar5) {
              local_68 = *plVar5;
              lStack_60 = plVar3[3];
            }
            else {
              local_68 = *plVar5;
              local_78 = (long *)*plVar3;
            }
            local_70 = plVar3[1];
            *plVar3 = (long)plVar5;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            plVar3 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_78,(ulong)(local_a8->_M_dataplus)._M_p);
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            psVar4 = (size_type *)(plVar3 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar3 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar4) {
              local_f8.field_2._M_allocated_capacity = *psVar4;
              local_f8.field_2._8_8_ = plVar3[3];
            }
            else {
              local_f8.field_2._M_allocated_capacity = *psVar4;
              local_f8._M_dataplus._M_p = (pointer)*plVar3;
            }
            local_f8._M_string_length = plVar3[1];
            *plVar3 = (long)psVar4;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            plVar3 = (long *)std::__cxx11::string::append((char *)&local_f8);
            local_160 = &local_150;
            plVar5 = plVar3 + 2;
            if ((long *)*plVar3 == plVar5) {
              local_150 = *plVar5;
              lStack_148 = plVar3[3];
            }
            else {
              local_150 = *plVar5;
              local_160 = (long *)*plVar3;
            }
            local_158 = plVar3[1];
            *plVar3 = (long)plVar5;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            plVar3 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_160,(ulong)local_140._M_dataplus._M_p);
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            psVar4 = (size_type *)(plVar3 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar3 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar4) {
              local_188.field_2._M_allocated_capacity = *psVar4;
              local_188.field_2._8_8_ = plVar3[3];
            }
            else {
              local_188.field_2._M_allocated_capacity = *psVar4;
              local_188._M_dataplus._M_p = (pointer)*plVar3;
            }
            local_188._M_string_length = plVar3[1];
            *plVar3 = (long)psVar4;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_168,(ulong)local_188._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_160 != &local_150) {
              operator_delete(local_160,local_150 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            if (local_78 != &local_68) {
              operator_delete(local_78,local_68 + 1);
            }
            if (local_98 != &local_88) {
              operator_delete(local_98,local_88 + 1);
            }
            uVar7 = local_50.field_2._M_allocated_capacity;
            _Var8._M_p = local_50._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_002f1aae:
              operator_delete(_Var8._M_p,uVar7 + 1);
            }
          }
          else {
            std::operator+(&local_f8,local_b8,&local_d8);
            plVar3 = (long *)std::__cxx11::string::append((char *)&local_f8);
            local_160 = &local_150;
            plVar5 = plVar3 + 2;
            if ((long *)*plVar3 == plVar5) {
              local_150 = *plVar5;
              lStack_148 = plVar3[3];
            }
            else {
              local_150 = *plVar5;
              local_160 = (long *)*plVar3;
            }
            local_158 = plVar3[1];
            *plVar3 = (long)plVar5;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            plVar3 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_160,(ulong)local_120._M_dataplus._M_p);
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            psVar4 = (size_type *)(plVar3 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar3 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar4) {
              local_188.field_2._M_allocated_capacity = *psVar4;
              local_188.field_2._8_8_ = plVar3[3];
            }
            else {
              local_188.field_2._M_allocated_capacity = *psVar4;
              local_188._M_dataplus._M_p = (pointer)*plVar3;
            }
            local_188._M_string_length = plVar3[1];
            *plVar3 = (long)psVar4;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_168,(ulong)local_188._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_160 != &local_150) {
              operator_delete(local_160,local_150 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            if (((field->value).type.enum_def == (EnumDef *)0x0) ||
               (9 < (field->value).type.base_type - BASE_TYPE_UTYPE)) {
              std::__cxx11::string::append((char *)local_168);
              SwiftConstant_abi_cxx11_(&local_188,local_100,field);
              std::__cxx11::string::_M_append((char *)local_168,(ulong)local_188._M_dataplus._M_p);
              uVar7 = local_188.field_2._M_allocated_capacity;
              _Var8._M_p = local_188._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != &local_188.field_2) goto LAB_002f1aae;
            }
          }
          std::__cxx11::string::append((char *)local_168);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
          }
          uVar7 = local_140.field_2._M_allocated_capacity;
          _Var8._M_p = local_140._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) goto LAB_002f1b8a;
        }
        struct_def = local_a0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          struct_def = local_a0;
        }
      }
      ppFVar6 = ppFVar6 + 1;
    } while (ppFVar6 !=
             (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void GenerateStructArgs(const StructDef &struct_def, std::string *code_ptr,
                          const std::string &nameprefix,
                          const std::string &object_name,
                          const std::string &obj_api_named = "",
                          bool is_obj_api = false) {
    auto &code = *code_ptr;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      if (field.deprecated) continue;
      const auto &field_type = field.value.type;
      if (IsStruct(field.value.type)) {
        GenerateStructArgs(
            *field_type.struct_def, code_ptr, (nameprefix + field.name),
            (object_name + "." + field.name), obj_api_named, is_obj_api);
      } else {
        const auto field_var = namer_.Variable(field);
        const auto field_field = namer_.Field(field);
        const auto type = GenType(field.value.type);
        if (!is_obj_api) {
          code += nameprefix + field_var + ": " + type;
          if (!IsEnum(field.value.type)) {
            code += " = ";
            code += SwiftConstant(field);
          }
          code += ", ";
          continue;
        }
        code += nameprefix + field_var + ": " + obj_api_named + object_name +
                "." + field_field;
        code += ", ";
      }
    }
  }